

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint64_t uVar1;
  CURLcode CVar2;
  ostream *poVar3;
  long lVar4;
  uint64_t uVar5;
  ulong number;
  char *pcVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_R9;
  uint64_t uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint64_t uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  string local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  string uri;
  push_marker_options_t opts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vtt_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> segment_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_bytes_vtt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_bytes;
  string uri_vtt;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  in_emsg_list;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  in_vtt_list;
  string vtt_track;
  string event_track;
  string out_meta;
  fstream oft_vtt;
  char local_440 [512];
  fstream oft;
  char local_230 [512];
  
  push_marker_options_t::push_marker_options_t(&opts);
  push_marker_options_t::parse_options(&opts,argc,argv);
  if ((opts.send_event_ == false) && (opts.send_vtt_ == false)) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "not configured to send event track or vtt track, use option --vtt when setting option --no_event"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    push_marker_options_t::~push_marker_options_t(&opts);
    return 0;
  }
  std::operator+(&uri,&opts.url_,"/Streams(out_meta.cmfm)");
  std::operator+(&uri_vtt,&opts.url_,"/Streams(out_vtt.cmft)");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&event_track,"events",(allocator<char> *)&oft);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vtt_track,"vtt_time",(allocator<char> *)&oft);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oft_vtt,
                 &event_track,".cmfm");
  std::fstream::fstream(&oft,(string *)&oft_vtt,_S_out|_S_bin);
  std::__cxx11::string::~string((string *)&oft_vtt);
  std::operator+(&out_meta,&vtt_track,".cmft");
  std::fstream::fstream(&oft_vtt,(string *)&out_meta,_S_out|_S_bin);
  std::__cxx11::string::~string((string *)&out_meta);
  header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (opts.send_event_ == true) {
    ::event_track::get_meta_header_bytes(opts.track_id_,opts.timescale_,&header_bytes,false);
  }
  if (opts.send_vtt_ == true) {
    ::event_track::get_meta_header_bytes(opts.track_id_ + 1,opts.timescale_,&header_bytes_vtt,true);
  }
  if (opts.dry_run_ == true) {
    if (opts.send_event_ != false) {
      std::ostream::write(local_230,
                          (long)header_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    }
    if (opts.send_vtt_ == true) {
      std::ostream::write(local_440,
                          (long)header_bytes_vtt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    if (opts.send_event_ != false) {
      if (opts.init_string_._M_string_length < 2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"posting event segment to: ");
        poVar3 = std::operator<<(poVar3,(string *)&uri);
        std::endl<char,std::char_traits<char>>(poVar3);
        CVar2 = PostCurlIngestConnection::send_curl_post(&uri,&header_bytes);
        if (CVar2 != CURLE_OK) goto LAB_00105c96;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&out_meta,"events",(allocator<char> *)&local_740);
        std::operator+(&local_780,&opts.url_,"/");
        get_path_from_template(&local_760,&opts.init_string_,&out_meta,0,0);
        std::operator+(&local_740,&local_780,&local_760);
        std::__cxx11::string::operator=((string *)&uri,(string *)&local_740);
        std::__cxx11::string::~string((string *)&local_740);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::~string((string *)&local_780);
        poVar3 = std::operator<<((ostream *)&std::cout,"posting event segment to: ");
        poVar3 = std::operator<<(poVar3,(string *)&uri);
        std::endl<char,std::char_traits<char>>(poVar3);
        CVar2 = PostCurlIngestConnection::send_curl_post(&uri,&header_bytes);
        if (CVar2 != CURLE_OK) goto LAB_00105c96;
        std::__cxx11::string::~string((string *)&out_meta);
      }
    }
    if (opts.send_vtt_ == true) {
      if (opts.init_string_._M_string_length < 2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"posting \'vttt segment to: ");
        poVar3 = std::operator<<(poVar3,(string *)&uri_vtt);
        std::endl<char,std::char_traits<char>>(poVar3);
        CVar2 = PostCurlIngestConnection::send_curl_post(&uri_vtt,&header_bytes_vtt);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"posting \'vttt segment to: ");
        poVar3 = std::operator<<(poVar3,(string *)&uri_vtt);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::operator+(&local_740,&opts.url_,"/");
        get_path_from_template(&local_780,&opts.init_string_,&vtt_track,0,0);
        std::operator+(&out_meta,&local_740,&local_780);
        std::__cxx11::string::operator=((string *)&uri_vtt,(string *)&out_meta);
        std::__cxx11::string::~string((string *)&out_meta);
        std::__cxx11::string::~string((string *)&local_780);
        std::__cxx11::string::~string((string *)&local_740);
        CVar2 = PostCurlIngestConnection::send_curl_post(&uri_vtt,&header_bytes_vtt);
      }
      if (CVar2 != CURLE_OK) {
LAB_00105c96:
        exit(1);
      }
    }
  }
  uVar10 = 0;
LAB_001051e7:
  do {
    lVar4 = std::chrono::_V2::system_clock::now();
    uVar7 = opts.seg_dur_;
    uVar8 = lVar4 / 1000000 + opts.announce_;
    auVar13._8_4_ = (int)(uVar8 >> 0x20);
    auVar13._0_8_ = uVar8;
    auVar13._12_4_ = 0x45300000;
    dVar16 = (auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
    auVar14._8_4_ = (int)(opts.seg_dur_ >> 0x20);
    auVar14._0_8_ = opts.seg_dur_;
    auVar14._12_4_ = 0x45300000;
    dVar12 = ceil(dVar16 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)opts.seg_dur_) - 4503599627370496.0)));
    uVar1 = opts.avail_dur_;
    uVar11 = opts.avail_interval_;
    number = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
  } while (uVar10 == number);
  auVar15._8_4_ = (int)(opts.avail_interval_ >> 0x20);
  auVar15._0_8_ = opts.avail_interval_;
  auVar15._12_4_ = 0x45300000;
  dVar12 = floor(dVar16 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)opts.avail_interval_) -
                          4503599627370496.0)));
  poVar3 = std::operator<<((ostream *)&std::cout," next_K is : ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  in_emsg_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_vtt_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_emsg_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_emsg_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_vtt_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_vtt_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (opts.send_vtt_ == true) {
    for (uVar9 = 0; uVar9 < opts.seg_dur_; uVar9 = uVar9 + 100) {
      uVar5 = opts.seg_dur_ * number + (ulong)uVar9;
      generate_event_message_vtt_time
                ((DASHEventMessageBoxv1 *)&out_meta,(uint32_t)uVar5,uVar5,100,1000,(uint32_t)in_R9);
      std::
      vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ::push_back(&in_vtt_list,(DASHEventMessageBoxv1 *)&out_meta);
      ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                ((DASHEventMessageBoxv1 *)&out_meta);
    }
  }
  if (opts.send_event_ == true) {
    uVar10 = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
    uVar5 = uVar11 * uVar10;
    if ((uVar8 < uVar1 + uVar5) && (uVar5 - opts.avail_dur_ <= uVar8)) {
      in_R9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)opts.splice_immediate_
      ;
      generate_event_message_splice_insert
                ((DASHEventMessageBoxv1 *)&out_meta,(uint32_t)uVar10,uVar5,opts.avail_dur_,
                 opts.timescale_,opts.splice_immediate_);
      poVar3 = std::operator<<((ostream *)&std::cout," === ad slot is active == ");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::
      vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ::push_back(&in_emsg_list,(value_type *)&out_meta);
      ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                ((DASHEventMessageBoxv1 *)&out_meta);
    }
    uVar11 = (uVar10 + 1) * uVar11;
    if ((uVar8 < uVar1 + uVar11) && (uVar11 - opts.avail_dur_ <= uVar8)) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               " == ad slot is active, pushing segment with markers == ");
      std::endl<char,std::char_traits<char>>(poVar3);
      in_R9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)opts.splice_immediate_
      ;
      generate_event_message_splice_insert
                ((DASHEventMessageBoxv1 *)&out_meta,(uint32_t)uVar10 + 1,uVar11,opts.avail_dur_,
                 opts.timescale_,opts.splice_immediate_);
      std::
      vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ::push_back(&in_emsg_list,(value_type *)&out_meta);
      ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                ((DASHEventMessageBoxv1 *)&out_meta);
    }
  }
  uVar11 = uVar7 * number;
  segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = uVar7 + uVar11;
  vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (opts.send_event_ == true) {
    in_R9 = &segment_bytes;
    ::event_track::get_meta_segment_bytes
              (&in_emsg_list,uVar11,uVar7,opts.track_id_,opts.timescale_,in_R9,(uint32_t)number,
               false);
  }
  if (opts.send_vtt_ == true) {
    in_R9 = &vtt_bytes;
    ::event_track::get_meta_segment_bytes
              (&in_vtt_list,uVar11,uVar7,opts.track_id_ + 1,opts.timescale_,in_R9,(uint32_t)number,
               true);
  }
  if (opts.dry_run_ == true) {
    if (opts.send_event_ != false) {
      std::ostream::write(local_230,
                          (long)segment_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::ostream::flush();
    }
    if (opts.send_vtt_ == true) {
      std::ostream::write(local_440,
                          (long)vtt_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::ostream::flush();
    }
  }
  else {
    if (opts.send_event_ != false) {
      std::__cxx11::string::string((string *)&out_meta,(string *)&uri);
      if (2 < opts.media_string_._M_string_length) {
        std::operator+(&local_780,&opts.url_,"/");
        get_path_from_template
                  (&local_760,&opts.media_string_,&event_track,opts.seg_dur_ * number,number);
        std::operator+(&local_740,&local_780,&local_760);
        std::__cxx11::string::operator=((string *)&uri,(string *)&local_740);
        std::__cxx11::string::~string((string *)&local_740);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&opts.url_,"/");
        get_path_from_template(&local_760,&opts.init_string_,&event_track,0,0);
        std::operator+(&local_740,&local_780,&local_760);
        std::__cxx11::string::operator=((string *)&out_meta,(string *)&local_740);
        std::__cxx11::string::~string((string *)&local_740);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::~string((string *)&local_780);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"posting event track segment to ");
      poVar3 = std::operator<<(poVar3,(string *)&uri);
      std::endl<char,std::char_traits<char>>(poVar3);
      CVar2 = PostCurlIngestConnection::send_curl_post(&uri,&segment_bytes);
      pcVar6 = "posted segment with timed metadata bytes";
      if (CVar2 != CURLE_OK) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "error posting segment with webvtt bytes, retry logic not implemented yet"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"posting event track init segment to ");
        poVar3 = std::operator<<(poVar3,(string *)&out_meta);
        std::endl<char,std::char_traits<char>>(poVar3);
        CVar2 = PostCurlIngestConnection::send_curl_post(&out_meta,&header_bytes);
        if (CVar2 != CURLE_OK) goto LAB_00105c96;
        poVar3 = std::operator<<((ostream *)&std::cout,"posting event track  segment to ");
        poVar3 = std::operator<<(poVar3,(string *)&uri);
        std::endl<char,std::char_traits<char>>(poVar3);
        CVar2 = PostCurlIngestConnection::send_curl_post(&uri,&segment_bytes);
        pcVar6 = "retry logic succeeded, segment retransmitted";
        if (CVar2 != CURLE_OK) goto LAB_00105c96;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&out_meta);
    }
    if (opts.send_vtt_ == true) {
      std::__cxx11::string::string((string *)&out_meta,(string *)&uri_vtt);
      if (opts.media_string_._M_string_length != 0) {
        std::operator+(&local_780,&opts.url_,"/");
        get_path_from_template
                  (&local_760,&opts.media_string_,&vtt_track,opts.seg_dur_ * number,number);
        std::operator+(&local_740,&local_780,&local_760);
        std::__cxx11::string::operator=((string *)&uri_vtt,(string *)&local_740);
        std::__cxx11::string::~string((string *)&local_740);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::~string((string *)&local_780);
        std::operator+(&local_780,&opts.url_,"/");
        get_path_from_template(&local_760,&opts.init_string_,&vtt_track,0,0);
        std::operator+(&local_740,&local_780,&local_760);
        std::__cxx11::string::operator=((string *)&out_meta,(string *)&local_740);
        std::__cxx11::string::~string((string *)&local_740);
        std::__cxx11::string::~string((string *)&local_760);
        std::__cxx11::string::~string((string *)&local_780);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"posting vtt track  segment to ");
      poVar3 = std::operator<<(poVar3,(string *)&uri_vtt);
      std::endl<char,std::char_traits<char>>(poVar3);
      CVar2 = PostCurlIngestConnection::send_curl_post(&uri_vtt,&vtt_bytes);
      pcVar6 = "posted segment with vtt bytes";
      if (CVar2 != CURLE_OK) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "error posting segment with webvtt bytes, retry logic not implemented yet"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,"posting vtt track  init segment to ");
        poVar3 = std::operator<<(poVar3,(string *)&out_meta);
        std::endl<char,std::char_traits<char>>(poVar3);
        CVar2 = PostCurlIngestConnection::send_curl_post(&out_meta,&header_bytes_vtt);
        if (CVar2 != CURLE_OK) goto LAB_00105c96;
        poVar3 = std::operator<<((ostream *)&std::cout,"posting vtt track  segment to ");
        poVar3 = std::operator<<(poVar3,(string *)&uri_vtt);
        std::endl<char,std::char_traits<char>>(poVar3);
        CVar2 = PostCurlIngestConnection::send_curl_post(&uri_vtt,&vtt_bytes);
        pcVar6 = "retry logic succeeded, vtt segment retransmitted";
        if (CVar2 != CURLE_OK) goto LAB_00105c96;
      }
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&out_meta);
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>::
  ~vector(&in_vtt_list);
  std::
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>::
  ~vector(&in_emsg_list);
  uVar10 = number;
  goto LAB_001051e7;
}

Assistant:

int main(int argc, char* argv[])
{
    push_marker_options_t opts;
    opts.parse_options(argc, argv);

    if (!opts.send_event_ && !opts.send_vtt_) 
    {
        std::cout << "not configured to send event track or vtt track, use option --vtt when setting option --no_event" << std::endl;
        return 0;
    }
    
    uint64_t last_K = 0;
    std::string uri = opts.url_ + "/Streams(out_meta.cmfm)";
    std::string uri_vtt = opts.url_ + "/Streams(out_vtt.cmft)";
    // ad break and event characteristics
   
    uint64_t last_L = 0;
    uint64_t next_L = 0;

    std::string event_track = "events";
    std::string vtt_track = "vtt_time";

    std::fstream oft(event_track + ".cmfm" , std::ios::binary | std::ios::out);
    std::fstream oft_vtt(vtt_track + ".cmft", std::ios::binary | std::ios::out);

    std::vector<uint8_t> header_bytes;
    std::vector<uint8_t> header_bytes_vtt;

    if(opts.send_event_)
        event_track::get_meta_header_bytes(opts.track_id_, opts.timescale_, header_bytes, false);
    if(opts.send_vtt_)
        event_track::get_meta_header_bytes(opts.track_id_ + 1, opts.timescale_, header_bytes_vtt, true);
    
    if (opts.dry_run_) {
        if(opts.send_event_)
            oft.write((const char*)&header_bytes[0], header_bytes.size());
        if(opts.send_vtt_)
            oft_vtt.write((const char*)&header_bytes_vtt[0], header_bytes_vtt.size());
    }
    else {
        if (opts.send_event_)
            if (opts.init_string_.size() < 2) {
                std::cout << "posting event segment to: " << uri << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri, header_bytes) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
            else 
            {
                std::string out_meta = "events";
                uri = opts.url_ + "/" + get_path_from_template(opts.init_string_, out_meta, 0, 0);
                std::cout << "posting event segment to: " << uri << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri, header_bytes) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
        if (opts.send_vtt_)
            if (opts.init_string_.size() < 2) {
                std::cout << "posting 'vttt segment to: " << uri_vtt << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri_vtt, header_bytes_vtt) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
            else {
               
                std::cout << "posting 'vttt segment to: " << uri_vtt << std::endl;
                uri_vtt = opts.url_ + "/" + get_path_from_template(opts.init_string_, vtt_track, 0, 0);

                if (PostCurlIngestConnection::send_curl_post(uri_vtt, header_bytes_vtt) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
    }
    while (1) {
        auto t = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
        //std::time_t t = std::time(0);  // t is an integer type
        uint64_t t_d = (uint64_t)t + opts.announce_;

        uint64_t next_K =  (uint64_t) std::ceil( t_d / (double) opts.seg_dur_ ); // calculate the next segment boundary
        last_L = (uint64_t)std::floor( t_d / (double) opts.avail_interval_);
        
        // the previous/current ad break (probably already ended) 
        uint64_t ad_start_last = last_L * opts.avail_interval_ ;
        uint64_t ad_end_last = ad_start_last + opts.avail_dur_ ;

        // the next ad break to announce
        uint64_t ad_start_next = (last_L + 1) * opts.avail_interval_;
        uint64_t ad_end_next = ad_start_next + opts.avail_dur_ ;

        if (next_K != last_K) {
            // fixed timescale 1000 and milliseconds based durations
            uint64_t seg_start = (uint64_t) ( next_K * opts.seg_dur_ );
            uint64_t seg_end = (uint64_t)   ( opts.seg_dur_ + seg_start);

            std::cout << " next_K is : " << next_K << std::endl;
            // std::cout << "next segment boundary is after: " << next_K * opts.seg_dur_  - t_d << " milliseconds" << std::endl;
            // std::cout << "previous tfdt was  " << t_d - last_K * opts.seg_dur_  << "  milli seconds ago" << std::endl;
            
            last_K = next_K;

            std::vector<event_track::DASHEventMessageBoxv1> in_emsg_list;
            std::vector<event_track::DASHEventMessageBoxv1> in_vtt_list;
            
            if (opts.send_vtt_) {
                
                for (unsigned int off = 0; off < opts.seg_dur_; off += 100) 
                {
                    auto ev_vtt = generate_event_message_vtt_time(
                        (uint32_t) (next_K * opts.seg_dur_ + off),
                        (uint64_t)next_K * opts.seg_dur_ + off,
                        (uint64_t)100,
                        (uint32_t)1000,
                        off
                    );

                    in_vtt_list.push_back(ev_vtt);
                }
            }
            if (opts.send_event_) {
                if (t_d < ad_end_last && t_d >= ad_start_last - opts.avail_dur_)
                {

                    auto ev = generate_event_message_splice_insert(
                        (uint32_t)last_L,
                        (uint64_t)ad_start_last,
                        (uint64_t)opts.avail_dur_,
                        (uint32_t)opts.timescale_,
                        opts.splice_immediate_
                    );
                    std::cout << " === ad slot is active == " << std::endl;

                    in_emsg_list.push_back(ev);
                }

                if (t_d < ad_end_next && t_d >= ad_start_next - opts.avail_dur_)
                {
                    std::cout << " == ad slot is active, pushing segment with markers == " << std::endl;

                    auto ev = generate_event_message_splice_insert(
                        (uint32_t)last_L + 1,
                        (uint64_t)ad_start_next,
                        (uint64_t)opts.avail_dur_,
                        opts.timescale_,
                        opts.splice_immediate_
                    );
                    // ev.print();

                    in_emsg_list.push_back(ev);
                }
            }
            std::vector<uint8_t> segment_bytes;
            std::vector<uint8_t> vtt_bytes;

            if (opts.send_event_) {
                event_track::get_meta_segment_bytes(
                    in_emsg_list,
                    seg_start,
                    seg_end,
                    opts.track_id_,
                    opts.timescale_,
                    segment_bytes,
                    (uint32_t)next_K,
                    false
                );
            }

            if (opts.send_vtt_) {
                event_track::get_meta_segment_bytes(
                    in_vtt_list,
                    seg_start,
                    seg_end,
                    opts.track_id_ + 1,
                    opts.timescale_,
                    vtt_bytes,
                    (uint32_t)next_K,
                    true
                );
            }

            // in case of dry run just write the output files
            if (opts.dry_run_) {
                if (opts.send_event_) {
                    oft.write((const char*)&segment_bytes[0], segment_bytes.size());
                    oft.flush();
                }
                if (opts.send_vtt_) {
                    oft_vtt.write((const char*)&vtt_bytes[0], vtt_bytes.size());
                    oft_vtt.flush();
                }
            }
            else {
                if (opts.send_event_) {
                    
                    std::string uri_h = uri;
                    
                    if (opts.media_string_.size() > 2) 
                    {  
                        uri = opts.url_ + "/" + get_path_from_template(opts.media_string_, event_track, next_K * opts.seg_dur_, next_K);
                        uri_h = opts.url_ + "/" + get_path_from_template(opts.init_string_, event_track, 0, 0);
                    }

                    std::cout << "posting event track segment to " << uri << std::endl;
                    if (PostCurlIngestConnection::send_curl_post(uri, segment_bytes) == CURLcode::CURLE_OK)
                        std::cout << ("posted segment with timed metadata bytes") << std::endl;
                    
                    else {
                        std::cout << ("error posting segment with webvtt bytes, retry logic not implemented yet") << std::endl;

                        std::cout << "posting event track init segment to " << uri_h << std::endl;
                        if (PostCurlIngestConnection::send_curl_post(uri_h, header_bytes) != CURLcode::CURLE_OK) {
                            std::exit(1);
                        }
                        else {
                            std::cout << "posting event track  segment to " << uri << std::endl;
                            if (PostCurlIngestConnection::send_curl_post(uri, segment_bytes) == CURLcode::CURLE_OK)
                                std::cout << "retry logic succeeded, segment retransmitted" << std::endl;
                            else
                                std::exit(1);
                        }
                    }
                }
                if (opts.send_vtt_) {

                    std::string uri_vtt_h = uri_vtt;

                    if (opts.media_string_.size() > 0)
                    {
                        uri_vtt = opts.url_ + "/" + get_path_from_template(opts.media_string_, vtt_track, next_K * opts.seg_dur_, next_K);
                        uri_vtt_h = opts.url_ + "/" + get_path_from_template(opts.init_string_, vtt_track, 0, 0);
                    }
                    std::cout << "posting vtt track  segment to " << uri_vtt << std::endl;
                    if (PostCurlIngestConnection::send_curl_post(uri_vtt, vtt_bytes) == CURLcode::CURLE_OK)
                        std::cout << ("posted segment with vtt bytes") << std::endl;
                    else {
                        std::cout << ("error posting segment with webvtt bytes, retry logic not implemented yet") << std::endl;
                
                        std::cout << "posting vtt track  init segment to " << uri_vtt_h << std::endl;
                        if (PostCurlIngestConnection::send_curl_post(uri_vtt_h, header_bytes_vtt) != CURLcode::CURLE_OK) {
                            std::exit(1);
                        }
                        else {
                            std::cout << "posting vtt track  segment to " << uri_vtt << std::endl;
                            if (PostCurlIngestConnection::send_curl_post(uri_vtt, vtt_bytes) == CURLcode::CURLE_OK) {
                                std::cout << "retry logic succeeded, vtt segment retransmitted" << std::endl;
                            }
                            else {
                                std::exit(1);
                            }
                        }
                    }
                }
            }
        }
    }
    std::exit(1);
}